

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_grids
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node,uint resX,uint resY)

{
  Node *pNVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  QuadMeshNode *pQVar5;
  ulong uVar6;
  long local_60;
  Ref<embree::SceneGraph::Node> local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Node *local_40;
  Ref<embree::SceneGraph::QuadMeshNode> local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar4 == (long *)0x0) {
      plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar4 == (long *)0x0) {
        plVar4 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar4 == (long *)0x0) {
          pQVar5 = (QuadMeshNode *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (pQVar5 != (QuadMeshNode *)0x0) {
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[2])(pQVar5);
            local_38.ptr = pQVar5;
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[2])(pQVar5);
            convert_quads_to_grids(this,&local_38,resX,resY);
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[3])(pQVar5);
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[3])(pQVar5);
            return (Ref<embree::SceneGraph::Node>)(Node *)this;
          }
        }
        else {
          local_40 = (Node *)this;
          (**(code **)(*plVar4 + 0x10))(plVar4);
          for (uVar6 = 0; uVar6 < (ulong)(plVar4[0xe] - plVar4[0xd] >> 3); uVar6 = uVar6 + 1) {
            local_58.ptr = *(Node **)(plVar4[0xd] + uVar6 * 8);
            if (local_58.ptr != (Node *)0x0) {
              (*((local_58.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_quads_to_grids((SceneGraph *)&local_60,&local_58,resX,resY);
            lVar2 = plVar4[0xd];
            plVar3 = *(long **)(lVar2 + uVar6 * 8);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 0x18))();
            }
            *(long *)(lVar2 + uVar6 * 8) = local_60;
            if (local_58.ptr != (Node *)0x0) {
              (*((local_58.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
          }
          (**(code **)(*plVar4 + 0x18))(plVar4);
          this = (SceneGraph *)local_40;
        }
      }
      else {
        (**(code **)(*plVar4 + 0x10))(plVar4);
        local_50.ptr = (Node *)plVar4[0x10];
        if (local_50.ptr != (Node *)0x0) {
          (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_quads_to_grids((SceneGraph *)&local_60,&local_50,resX,resY);
        if ((long *)plVar4[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar4[0x10] + 0x18))();
        }
        plVar4[0x10] = local_60;
        if (local_50.ptr != (Node *)0x0) {
          (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar4 + 0x18))(plVar4);
      }
    }
    else {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      local_48.ptr = (Node *)plVar4[0x13];
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_quads_to_grids((SceneGraph *)&local_60,&local_48,resX,resY);
      if ((long *)plVar4[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar4[0x13] + 0x18))();
      }
      plVar4[0x13] = local_60;
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar4 + 0x18))(plVar4);
    }
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids(Ref<SceneGraph::Node> node, const unsigned int resX, const unsigned int resY )
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    } 
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_quads_to_grids(groupNode->children[i], resX, resY);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      return convert_quads_to_grids(qmesh, resX, resY);
    }
    return node;
  }